

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  uint uVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  long lVar5;
  type_conflict5 tVar6;
  ulong uVar7;
  undefined8 *puVar8;
  long lVar9;
  uint *puVar10;
  uint *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  steeppr *psVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  DataKey local_2e8;
  ulong local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar17 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (pSVar2->thecovectors->set).thenum;
  uVar15 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar15;
  }
  local_2e0 = 0xffffffffffffffff;
  lVar16 = 0x78;
  lVar5 = 0x1c;
  local_2e8.info = 0;
  local_2e8.idx = 0;
  for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
    puVar8 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar16);
    puVar10 = (uint *)(puVar8 + -0xf);
    pnVar12 = &local_2b0;
    for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = *puVar10;
      puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = *(int *)(puVar8 + -1);
    local_2b0.m_backend.neg = *(bool *)((long)puVar8 + -4);
    local_2b0.m_backend._120_8_ = *puVar8;
    pnVar12 = tol;
    pnVar14 = &result;
    for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    result.m_backend.exp = (tol->m_backend).exp;
    result.m_backend.neg = (tol->m_backend).neg;
    result.m_backend.fpclass = (tol->m_backend).fpclass;
    result.m_backend.prec_elem = (tol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar6 = boost::multiprecision::operator<(&local_2b0,&result);
    if (tVar6) {
      pnVar12 = &local_2b0;
      psVar13 = local_b0;
      for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(uint *)psVar13 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        psVar13 = psVar13 + (ulong)bVar17 * -8 + 4;
      }
      local_40 = local_2b0.m_backend.exp;
      local_3c = local_2b0.m_backend.neg;
      local_38 = local_2b0.m_backend.fpclass;
      iStack_34 = local_2b0.m_backend.prec_elem;
      puVar10 = (uint *)((long)&(pnVar4->m_backend).data + lVar16 + -0x78);
      puVar11 = puVar10;
      pnVar12 = &local_130;
      for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = *puVar11;
        puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = puVar10[0x1c];
      local_130.m_backend.neg = SUB41(puVar10[0x1d],0);
      local_130.m_backend.fpclass = puVar10[0x1e];
      local_130.m_backend.prec_elem = puVar10[0x1f];
      pnVar12 = tol;
      pnVar14 = &local_1b0;
      for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (tol->m_backend).exp;
      local_1b0.m_backend.neg = (tol->m_backend).neg;
      local_1b0.m_backend.fpclass = (tol->m_backend).fpclass;
      local_1b0.m_backend.prec_elem = (tol->m_backend).prec_elem;
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_b0,&local_130,&local_1b0,&local_130);
      pnVar12 = &result;
      pnVar14 = &local_2b0;
      for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = result.m_backend.exp;
      local_2b0.m_backend.neg = result.m_backend.neg;
      local_2b0.m_backend.fpclass = result.m_backend.fpclass;
      local_2b0.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar6 = boost::multiprecision::operator>(&local_2b0,best);
      lVar9 = lVar5;
      pnVar12 = &local_2b0;
      pnVar14 = best;
      if (tVar6) {
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
        }
        (best->m_backend).exp = local_2b0.m_backend.exp;
        (best->m_backend).neg = local_2b0.m_backend.neg;
        (best->m_backend).fpclass = local_2b0.m_backend.fpclass;
        (best->m_backend).prec_elem = local_2b0.m_backend.prec_elem;
        local_2e8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::coId((this->
                                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).thesolver,(int)uVar15);
        local_2e0 = (ulong)local_2e8 >> 0x20;
      }
    }
    lVar16 = lVar16 + 0x80;
  }
  return (SPxId)((ulong)local_2e8 & 0xffffffff | local_2e0 << 0x20);
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}